

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraSublimeTextGenerator::CreateNewProjectFile
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *this_00;
  string_view arg;
  undefined8 uVar1;
  byte bVar2;
  uint uVar3;
  const_reference ppcVar4;
  string *psVar5;
  string *psVar6;
  ulong uVar7;
  ostream *poVar8;
  reference pbVar9;
  long lVar10;
  bool bVar11;
  bool local_5fa;
  bool local_5f9;
  string local_5b8;
  undefined1 local_598 [8];
  ostringstream e;
  string local_420 [8];
  string varValue;
  string varName;
  size_t pos;
  string *t;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_3a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string local_388;
  string local_368 [8];
  string systemName;
  MapSourceFileFlags sourceFileFlags;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string local_2f0;
  string *local_2d0;
  string *outputRelativeToSourceRoot;
  string *local_2a8;
  string *sourceRootRelativeToOutput;
  undefined1 local_290 [8];
  cmGeneratedFileStream fout;
  cmMakefile *mf;
  string *filename_local;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs_local;
  cmExtraSublimeTextGenerator *this_local;
  
  ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[](lgs,0);
  fout._608_8_ = cmLocalGenerator::GetMakefile(*ppcVar4);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_290,filename,false,None);
  bVar2 = std::ios::operator!((ios *)(local_290 + (long)*(_func_int **)((long)local_290 + -0x18)));
  if ((bVar2 & 1) == 0) {
    ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (lgs,0);
    psVar5 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(*ppcVar4);
    ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (lgs,0);
    psVar6 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(*ppcVar4);
    cmSystemTools::RelativePath((string *)&outputRelativeToSourceRoot,psVar5,psVar6);
    local_2a8 = (string *)&outputRelativeToSourceRoot;
    std::operator<<((ostream *)local_290,"{\n");
    std::operator<<((ostream *)local_290,"\t\"folders\":\n\t[\n\t");
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      poVar8 = std::operator<<((ostream *)local_290,"\t{\n\t\t\t\"path\": \"");
      poVar8 = std::operator<<(poVar8,local_2a8);
      std::operator<<(poVar8,"\"");
      ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (lgs,0);
      psVar5 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(*ppcVar4);
      ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (lgs,0);
      psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(*ppcVar4);
      cmSystemTools::RelativePath(&local_2f0,psVar5,psVar6);
      local_2d0 = &local_2f0;
      uVar3 = std::__cxx11::string::empty();
      bVar11 = false;
      local_5f9 = false;
      if ((uVar3 & 1) == 0) {
        uVar7 = std::__cxx11::string::length();
        bVar11 = 2 < uVar7;
        local_5fa = true;
        if (bVar11) {
          std::__cxx11::string::substr((ulong)&local_310,(ulong)local_2d0);
          local_5fa = std::operator!=(&local_310,"../");
        }
        local_5f9 = local_5fa;
      }
      if (bVar11) {
        std::__cxx11::string::~string((string *)&local_310);
      }
      if ((local_5f9 != false) && ((this->ExcludeBuildFolder & 1U) != 0)) {
        poVar8 = std::operator<<((ostream *)local_290,",\n\t\t\t\"folder_exclude_patterns\": [\"");
        poVar8 = std::operator<<(poVar8,(string *)local_2d0);
        std::operator<<(poVar8,"\"]");
      }
      std::__cxx11::string::~string((string *)&local_2f0);
    }
    else {
      std::operator<<((ostream *)local_290,"\t{\n\t\t\t\"path\": \"./\"");
    }
    std::operator<<((ostream *)local_290,"\n\t\t}");
    std::operator<<((ostream *)local_290,"\n\t]");
    std::operator<<((ostream *)local_290,",\n\t\"build_systems\":\n\t[\n\t");
    this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)((long)&systemName.field_2 + 8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::map(this_00);
    AppendAllTargets(this,lgs,(cmMakefile *)fout._608_8_,(cmGeneratedFileStream *)local_290,this_00)
    ;
    std::operator<<((ostream *)local_290,"\n\t]");
    uVar1 = fout._608_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_388,"CMAKE_SYSTEM_NAME",
               (allocator<char> *)
               ((long)&tokens.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    psVar5 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar1,&local_388);
    std::__cxx11::string::string(local_368,(string *)psVar5);
    std::__cxx11::string::~string((string *)&local_388);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&tokens.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    arg = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->EnvSettings);
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3a8,arg,false);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      std::operator<<((ostream *)local_290,",");
      std::operator<<((ostream *)local_290,"\n\t\"env\":");
      std::operator<<((ostream *)local_290,"\n\t{");
      poVar8 = std::operator<<((ostream *)local_290,"\n\t\t");
      poVar8 = std::operator<<(poVar8,local_368);
      std::operator<<(poVar8,":");
      std::operator<<((ostream *)local_290,"\n\t\t{");
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3a8);
      t = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3a8);
      while (bVar11 = __gnu_cxx::operator!=
                                (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)&t), bVar11) {
        pbVar9 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
        lVar10 = std::__cxx11::string::find_first_of((char)pbVar9,0x3d);
        if (lVar10 == -1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598);
          poVar8 = std::operator<<((ostream *)local_598,
                                   "Could not parse Env Vars specified in \"CMAKE_SUBLIME_TEXT_2_ENV_SETTINGS\""
                                  );
          poVar8 = std::operator<<(poVar8,", corrupted string ");
          std::operator<<(poVar8,(string *)pbVar9);
          uVar1 = fout._608_8_;
          std::__cxx11::ostringstream::str();
          cmMakefile::IssueMessage((cmMakefile *)uVar1,FATAL_ERROR,&local_5b8);
          std::__cxx11::string::~string((string *)&local_5b8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_598);
        }
        else {
          std::__cxx11::string::substr((ulong)((long)&varValue.field_2 + 8),(ulong)pbVar9);
          std::__cxx11::string::substr((ulong)local_420,(ulong)pbVar9);
          poVar8 = std::operator<<((ostream *)local_290,"\n\t\t\t\"");
          poVar8 = std::operator<<(poVar8,(string *)(varValue.field_2._M_local_buf + 8));
          poVar8 = std::operator<<(poVar8,"\":\"");
          poVar8 = std::operator<<(poVar8,local_420);
          std::operator<<(poVar8,"\"");
          std::__cxx11::string::~string(local_420);
          std::__cxx11::string::~string((string *)(varValue.field_2._M_local_buf + 8));
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      std::operator<<((ostream *)local_290,"\n\t\t}");
      std::operator<<((ostream *)local_290,"\n\t}");
    }
    std::operator<<((ostream *)local_290,"\n}");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3a8);
    std::__cxx11::string::~string(local_368);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            *)((long)&systemName.field_2 + 8));
    std::__cxx11::string::~string((string *)&outputRelativeToSourceRoot);
    sourceRootRelativeToOutput._0_4_ = 0;
  }
  else {
    sourceRootRelativeToOutput._0_4_ = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_290);
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::CreateNewProjectFile(
  const std::vector<cmLocalGenerator*>& lgs, const std::string& filename)
{
  const cmMakefile* mf = lgs[0]->GetMakefile();

  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  const std::string& sourceRootRelativeToOutput = cmSystemTools::RelativePath(
    lgs[0]->GetBinaryDirectory(), lgs[0]->GetSourceDirectory());
  // Write the folder entries to the project file
  fout << "{\n";
  fout << "\t\"folders\":\n\t[\n\t";
  if (!sourceRootRelativeToOutput.empty()) {
    fout << "\t{\n\t\t\t\"path\": \"" << sourceRootRelativeToOutput << "\"";
    const std::string& outputRelativeToSourceRoot =
      cmSystemTools::RelativePath(lgs[0]->GetSourceDirectory(),
                                  lgs[0]->GetBinaryDirectory());
    if ((!outputRelativeToSourceRoot.empty()) &&
        ((outputRelativeToSourceRoot.length() < 3) ||
         (outputRelativeToSourceRoot.substr(0, 3) != "../"))) {
      if (this->ExcludeBuildFolder) {
        fout << ",\n\t\t\t\"folder_exclude_patterns\": [\""
             << outputRelativeToSourceRoot << "\"]";
      }
    }
  } else {
    fout << "\t{\n\t\t\t\"path\": \"./\"";
  }
  fout << "\n\t\t}";
  // End of the folders section
  fout << "\n\t]";

  // Write the beginning of the build systems section to the project file
  fout << ",\n\t\"build_systems\":\n\t[\n\t";

  // Set of include directories over all targets (sublime text/sublimeclang
  // doesn't currently support these settings per build system, only project
  // wide
  MapSourceFileFlags sourceFileFlags;
  this->AppendAllTargets(lgs, mf, fout, sourceFileFlags);

  // End of build_systems
  fout << "\n\t]";
  std::string systemName = mf->GetSafeDefinition("CMAKE_SYSTEM_NAME");
  std::vector<std::string> tokens = cmExpandedList(this->EnvSettings);

  if (!this->EnvSettings.empty()) {
    fout << ",";
    fout << "\n\t\"env\":";
    fout << "\n\t{";
    fout << "\n\t\t" << systemName << ":";
    fout << "\n\t\t{";
    for (std::string const& t : tokens) {
      size_t const pos = t.find_first_of('=');

      if (pos != std::string::npos) {
        std::string varName = t.substr(0, pos);
        std::string varValue = t.substr(pos + 1);

        fout << "\n\t\t\t\"" << varName << "\":\"" << varValue << "\"";
      } else {
        std::ostringstream e;
        e << "Could not parse Env Vars specified in "
             "\"CMAKE_SUBLIME_TEXT_2_ENV_SETTINGS\""
          << ", corrupted string " << t;
        mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      }
    }
    fout << "\n\t\t}";
    fout << "\n\t}";
  }
  fout << "\n}";
}